

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O3

bool __thiscall
dlib::
binary_search_tree_kernel_2<unsigned_long,_char,_dlib::memory_manager_kernel_2<char,_100UL>,_std::less<unsigned_long>_>
::remove_least_element_in_tree
          (binary_search_tree_kernel_2<unsigned_long,_char,_dlib::memory_manager_kernel_2<char,_100UL>,_std::less<unsigned_long>_>
           *this,node *t,unsigned_long *d,char *r)

{
  unsigned_long *puVar1;
  char cVar2;
  unsigned_long uVar3;
  node *pnVar4;
  node *t_00;
  
  pnVar4 = (node *)t->left;
  if ((node *)t->left == (node *)this->NIL) {
    t_00 = t->right;
    (&t->parent->left)[t->parent->left != t] = t_00;
    if (this->tree_root == t) {
      this->tree_root = t_00;
    }
  }
  else {
    do {
      t = (node *)pnVar4;
      pnVar4 = *(node **)t;
    } while (*(node **)t != (node *)this->NIL);
    t_00 = *(node **)((long)t + 8);
    (*(node **)((long)t + 0x10))->left = t_00;
  }
  uVar3 = *d;
  *d = *(unsigned_long *)((long)t + 0x18);
  *(unsigned_long *)((long)t + 0x18) = uVar3;
  cVar2 = *r;
  *r = *(char *)((long)t + 0x20);
  *(char *)((long)t + 0x20) = cVar2;
  t_00->parent = *(node **)((long)t + 0x10);
  if (*(char *)((long)t + 0x21) == '\x01') {
    fix_after_remove(this,t_00);
  }
  pnVar4 = (node *)this->current_element;
  puVar1 = &(this->pool).allocations;
  *puVar1 = *puVar1 - 1;
  *(node **)t = (this->pool).next;
  (this->pool).next = (node *)t;
  return (node *)t == pnVar4;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    remove_least_element_in_tree (
        node* t,
        domain& d,
        range& r
    ) 
    {

        node* next = t->left;
        node* child;  // the child node of the one we will slice out

        if (next == NIL)
        {
            // need to determine if t is a left or right child
            if (t->parent->left == t)
                child = t->parent->left = t->right;
            else
                child = t->parent->right = t->right;

            // update tree_root if necessary
            if (t == tree_root)
                tree_root = child;
        }
        else
        {
            // find the least node
            do 
            {
                t = next;
                next = next->left;
            } while (next != NIL);
            // t is a left child
            child = t->parent->left = t->right;

        }
        
        // swap the item from this node into d and r
        exchange(d,t->d);
        exchange(r,t->r);

        // plug hole left by removing this node
        child->parent = t->parent;

        // keep the red-black properties true
        if (t->color == black)
            fix_after_remove(child);

        bool rvalue = (t == current_element);
        // free the memory for this removed node
        pool.deallocate(t);        
        return rvalue;
    }